

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int diamond_search_sad(FULLPEL_MV start_mv,uint start_mv_sad,FULLPEL_MOTION_SEARCH_PARAMS *ms_params
                      ,int search_step,int *num00,FULLPEL_MV *best_mv,FULLPEL_MV *second_best_mv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  FULLPEL_MV mv;
  int iVar6;
  bool bVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  undefined4 in_EDI;
  int *in_R8;
  short *in_R9;
  bool bVar14;
  undefined4 *in_stack_00000008;
  int next_step_size_1;
  uint thissad_2;
  uint8_t *check_here_1;
  FULLPEL_MV this_mv_2;
  int idx_2;
  uint thissad_1;
  FULLPEL_MV this_mv_1;
  int j_1;
  int j;
  uint sads [4];
  uchar *block_offset [4];
  int idx_1;
  int all_in;
  int best_site_1;
  int num_searches_1;
  search_site *site_1;
  int step_1;
  int next_step_size;
  uint thissad;
  uint8_t *check_here;
  FULLPEL_MV this_mv;
  int idx;
  int best_site;
  int num_searches;
  search_site *site;
  int step;
  uint bestsad;
  uint8_t *best_address;
  FULLPEL_MV tmp_second_best_mv;
  int tot_steps;
  int num_center_steps;
  int is_off_center;
  search_site_config *cfg;
  MV_COST_PARAMS *mv_cost_params;
  int ref_stride;
  int src_stride;
  uint8_t *src_buf;
  buf_2d *ref;
  buf_2d *src;
  MV_COST_PARAMS *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  int local_100;
  int in_stack_ffffffffffffff04;
  uint8_t *in_stack_ffffffffffffff08;
  buf_2d *in_stack_ffffffffffffff10;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff18;
  int local_c0;
  int local_b8;
  int local_a4;
  int local_a0;
  FULLPEL_MV local_90;
  int local_8c;
  int local_88;
  int local_78;
  uint local_74;
  uint8_t *local_70;
  undefined4 local_68;
  int local_60;
  
  uVar4 = **(undefined8 **)(in_RDX + 0x18);
  uVar1 = *(undefined4 *)(*(undefined8 **)(in_RDX + 0x18) + 3);
  uVar2 = *(undefined4 *)(*(long *)(in_RDX + 0x10) + 0x18);
  lVar5 = *(long *)(in_RDX + 0x50);
  bVar7 = false;
  local_60 = 0;
  local_a4 = *(int *)(lVar5 + 0xbb0) - in_ECX;
  if (in_stack_00000008 != (undefined4 *)0x0) {
    local_68 = *in_stack_00000008;
  }
  *(undefined4 *)in_R9 = in_EDI;
  local_70 = get_buf_from_fullmv((buf_2d *)
                                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                                 (FULLPEL_MV *)in_stack_fffffffffffffec8);
  local_74 = in_ESI;
  if (*(long *)(in_RDX + 0x20) == 0) {
    while (iVar6 = local_a4, local_a4 = iVar6 + -1, -1 < local_a4) {
      lVar13 = lVar5 + (long)local_a4 * 0x88;
      iVar3 = *(int *)(lVar5 + 0xbb4 + (long)local_a4 * 4);
      local_b8 = 0;
      if (*(int *)(in_RDX + 0x5c) < (int)in_R9[1] + (int)*(short *)(lVar13 + 0x22) ||
          ((int)in_R9[1] + (int)*(short *)(lVar13 + 0x1a) < *(int *)(in_RDX + 0x58) ||
          (*(int *)(in_RDX + 100) < (int)*in_R9 + (int)*(short *)(lVar13 + 0x10) ||
          (int)*in_R9 + (int)*(short *)(lVar13 + 8) < *(int *)(in_RDX + 0x60)))) {
        for (iVar10 = 1; iVar10 <= iVar3; iVar10 = iVar10 + 1) {
          sVar8 = *in_R9 + *(short *)(lVar13 + (long)iVar10 * 8);
          sVar9 = in_R9[1] + *(short *)(lVar13 + 2 + (long)iVar10 * 8);
          mv.col = sVar9;
          mv.row = sVar8;
          iVar12 = av1_is_fullmv_in_range((FullMvLimits *)(in_RDX + 0x58),mv);
          if ((iVar12 != 0) &&
             (in_stack_fffffffffffffee4 =
                   get_mvpred_sad((FULLPEL_MOTION_SEARCH_PARAMS *)
                                  CONCAT44(iVar10,CONCAT22(sVar9,sVar8)),
                                  (buf_2d *)(local_70 + *(int *)(lVar13 + 4 + (long)iVar10 * 8)),
                                  (uint8_t *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                  in_stack_fffffffffffffedc), in_stack_fffffffffffffee4 < local_74))
          {
            iVar12 = mvsad_err_cost_((FULLPEL_MV *)
                                     CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                                     in_stack_fffffffffffffec8);
            in_stack_fffffffffffffee4 = iVar12 + in_stack_fffffffffffffee4;
            if (in_stack_fffffffffffffee4 < local_74) {
              local_b8 = iVar10;
              local_74 = in_stack_fffffffffffffee4;
            }
          }
        }
      }
      else {
        for (local_c0 = 1; local_c0 <= iVar3; local_c0 = local_c0 + 4) {
          for (iVar10 = 0; iVar10 < 4; iVar10 = iVar10 + 1) {
            *(uint8_t **)(&stack0xffffffffffffff18 + (long)iVar10 * 8) =
                 local_70 + *(int *)(lVar13 + 4 + (long)(local_c0 + iVar10) * 8);
          }
          (**(code **)(in_RDX + 0xd0))
                    (uVar4,uVar1,&stack0xffffffffffffff18,uVar2,&stack0xffffffffffffff08);
          for (local_100 = 0; local_100 < 4; local_100 = local_100 + 1) {
            if (*(uint *)(&stack0xffffffffffffff08 + (long)local_100 * 4) < local_74) {
              iVar10 = *(int *)(&stack0xffffffffffffff08 + (long)local_100 * 4);
              iVar12 = mvsad_err_cost_((FULLPEL_MV *)
                                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                                       ,in_stack_fffffffffffffec8);
              if ((uint)(iVar10 + iVar12) < local_74) {
                local_b8 = local_c0 + local_100;
                local_74 = iVar10 + iVar12;
              }
            }
          }
        }
      }
      if (local_b8 != 0) {
        local_68 = *(undefined4 *)in_R9;
        *in_R9 = *in_R9 + *(short *)(lVar13 + (long)local_b8 * 8);
        in_R9[1] = in_R9[1] + *(short *)(lVar13 + 2 + (long)local_b8 * 8);
        local_70 = local_70 + *(int *)(lVar13 + 4 + (long)local_b8 * 8);
        bVar7 = true;
      }
      if (!bVar7) {
        local_60 = local_60 + 1;
      }
      if ((local_b8 == 0) && (2 < local_a4)) {
        in_stack_fffffffffffffee0 = *(int *)(lVar5 + 0xc0c + (long)(iVar6 + -2) * 4);
        while (bVar14 = in_stack_fffffffffffffee0 == *(int *)(lVar5 + 0xc0c + (long)local_a4 * 4),
              in_stack_fffffffffffffed7 = bVar14 && 2 < local_a4, bVar14 && 2 < local_a4) {
          local_60 = local_60 + 1;
          in_stack_fffffffffffffee0 = *(int *)(lVar5 + 0xc0c + (long)(local_a4 + -2) * 4);
          local_a4 = local_a4 + -1;
        }
      }
    }
  }
  else {
    while (iVar6 = local_a4, local_78 = iVar6 + -1, -1 < local_78) {
      lVar13 = lVar5 + (long)local_78 * 0x88;
      iVar3 = *(int *)(lVar5 + 0xbb4 + (long)local_78 * 4);
      local_88 = 0;
      for (local_8c = 1; local_8c <= iVar3; local_8c = local_8c + 1) {
        local_90.col = in_R9[1] + *(short *)(lVar13 + 2 + (long)local_8c * 8);
        local_90.row = *in_R9 + *(short *)(lVar13 + (long)local_8c * 8);
        iVar10 = av1_is_fullmv_in_range((FullMvLimits *)(in_RDX + 0x58),local_90);
        if ((iVar10 != 0) &&
           (uVar11 = get_mvpred_compound_sad
                               (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                in_stack_ffffffffffffff08,in_stack_ffffffffffffff04),
           uVar11 < local_74)) {
          iVar10 = mvsad_err_cost_((FULLPEL_MV *)
                                   CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                                   in_stack_fffffffffffffec8);
          if (iVar10 + uVar11 < local_74) {
            local_88 = local_8c;
            local_74 = iVar10 + uVar11;
          }
        }
      }
      if (local_88 != 0) {
        local_68 = *(undefined4 *)in_R9;
        *in_R9 = *in_R9 + *(short *)(lVar13 + (long)local_88 * 8);
        in_R9[1] = in_R9[1] + *(short *)(lVar13 + 2 + (long)local_88 * 8);
        bVar7 = true;
      }
      if (!bVar7) {
        local_60 = local_60 + 1;
      }
      local_a4 = local_78;
      if ((local_88 == 0) && (2 < local_78)) {
        local_a0 = *(int *)(lVar5 + 0xc0c + (long)(iVar6 + -2) * 4);
        while (local_a4 = local_78,
              local_a0 == *(int *)(lVar5 + 0xc0c + (long)local_78 * 4) && 2 < local_78) {
          local_60 = local_60 + 1;
          local_a0 = *(int *)(lVar5 + 0xc0c + (long)(local_78 + -2) * 4);
          local_78 = local_78 + -1;
        }
      }
    }
  }
  *in_R8 = local_60;
  if (in_stack_00000008 != (undefined4 *)0x0) {
    *in_stack_00000008 = local_68;
  }
  return local_74;
}

Assistant:

static int diamond_search_sad(FULLPEL_MV start_mv, unsigned int start_mv_sad,
                              const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                              const int search_step, int *num00,
                              FULLPEL_MV *best_mv, FULLPEL_MV *second_best_mv) {
#define UPDATE_SEARCH_STEP                                      \
  do {                                                          \
    if (best_site != 0) {                                       \
      tmp_second_best_mv = *best_mv;                            \
      best_mv->row += site[best_site].mv.row;                   \
      best_mv->col += site[best_site].mv.col;                   \
      best_address += site[best_site].offset;                   \
      is_off_center = 1;                                        \
    }                                                           \
                                                                \
    if (is_off_center == 0) num_center_steps++;                 \
                                                                \
    if (best_site == 0 && step > 2) {                           \
      int next_step_size = cfg->radius[step - 1];               \
      while (next_step_size == cfg->radius[step] && step > 2) { \
        num_center_steps++;                                     \
        --step;                                                 \
        next_step_size = cfg->radius[step - 1];                 \
      }                                                         \
    }                                                           \
  } while (0)

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;

  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;

  const search_site_config *cfg = ms_params->search_sites;

  int is_off_center = 0;
  // Number of times that we have stayed in the middle. This is used to skip
  // search steps in the future if diamond_search_sad is called again.
  int num_center_steps = 0;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  FULLPEL_MV tmp_second_best_mv;
  if (second_best_mv) {
    tmp_second_best_mv = *second_best_mv;
  }

  *best_mv = start_mv;

  // Check the starting position
  const uint8_t *best_address = get_buf_from_fullmv(ref, &start_mv);
  unsigned int bestsad = start_mv_sad;

  // TODO(chiyotsai@google.com): Implement 4 points search for msdf&sdaf
  if (ms_params->ms_buffers.second_pred) {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      for (int idx = 1; idx <= num_searches; idx++) {
        const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                     best_mv->col + site[idx].mv.col };

        if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
          const uint8_t *const check_here = site[idx].offset + best_address;
          unsigned int thissad =
              get_mvpred_compound_sad(ms_params, src, check_here, ref_stride);

          if (thissad < bestsad) {
            thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
            if (thissad < bestsad) {
              bestsad = thissad;
              best_site = idx;
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  } else {
    for (int step = tot_steps - 1; step >= 0; --step) {
      const search_site *site = cfg->site[step];
      const int num_searches = cfg->searches_per_step[step];
      int best_site = 0;

      int all_in = 1;
      // Trap illegal vectors
      all_in &= best_mv->row + site[1].mv.row >= ms_params->mv_limits.row_min;
      all_in &= best_mv->row + site[2].mv.row <= ms_params->mv_limits.row_max;
      all_in &= best_mv->col + site[3].mv.col >= ms_params->mv_limits.col_min;
      all_in &= best_mv->col + site[4].mv.col <= ms_params->mv_limits.col_max;

      if (all_in) {
        for (int idx = 1; idx <= num_searches; idx += 4) {
          unsigned char const *block_offset[4];
          unsigned int sads[4];

          for (int j = 0; j < 4; j++)
            block_offset[j] = site[idx + j].offset + best_address;

          ms_params->sdx4df(src_buf, src_stride, block_offset, ref_stride,
                            sads);
          for (int j = 0; j < 4; j++) {
            if (sads[j] < bestsad) {
              const FULLPEL_MV this_mv = { best_mv->row + site[idx + j].mv.row,
                                           best_mv->col +
                                               site[idx + j].mv.col };
              unsigned int thissad =
                  sads[j] + mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx + j;
              }
            }
          }
        }
      } else {
        for (int idx = 1; idx <= num_searches; idx++) {
          const FULLPEL_MV this_mv = { best_mv->row + site[idx].mv.row,
                                       best_mv->col + site[idx].mv.col };

          if (av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
            const uint8_t *const check_here = site[idx].offset + best_address;
            unsigned int thissad =
                get_mvpred_sad(ms_params, src, check_here, ref_stride);

            if (thissad < bestsad) {
              thissad += mvsad_err_cost_(&this_mv, mv_cost_params);
              if (thissad < bestsad) {
                bestsad = thissad;
                best_site = idx;
              }
            }
          }
        }
      }
      UPDATE_SEARCH_STEP;
    }
  }

  *num00 = num_center_steps;
  if (second_best_mv) {
    *second_best_mv = tmp_second_best_mv;
  }

  return bestsad;

#undef UPDATE_SEARCH_STEP
}